

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(static_string_view *l,
                   StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  type tVar1;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30;
  
  local_40._M_len = (l->super_string_view)._M_len;
  local_40._M_str = (l->super_string_view)._M_str;
  StringOpPlus::operator_cast_to_string(&local_30,(StringOpPlus *)r);
  tVar1 = operator==(&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return tVar1;
}

Assistant:

static string_view view(static_string_view const& s) { return s; }